

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O2

void __thiscall SpeciesTracker::Add(SpeciesTracker *this,string *promoter_name,Ptr *polymer)

{
  size_type sVar1;
  mapped_type *pmVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
  *this_00;
  initializer_list<std::shared_ptr<Polymer>_> __l;
  allocator_type local_49;
  __shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2> local_48;
  vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_> local_38;
  
  this_00 = &this->promoter_map_;
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
          ::count(this_00,promoter_name);
  if (sVar1 != 0) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
             ::operator[](this_00,promoter_name);
    std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>::push_back
              (pmVar2,polymer);
    return;
  }
  std::__shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,&polymer->super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_48;
  std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>::vector
            (&local_38,__l,&local_49);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
           ::operator[](this_00,promoter_name);
  std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>::_M_move_assign
            (pmVar2,&local_38);
  std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>::~vector
            (&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  return;
}

Assistant:

void SpeciesTracker::Add(const std::string &promoter_name,
                         Polymer::Ptr polymer) {
  if (promoter_map_.count(promoter_name) == 0) {
    promoter_map_[promoter_name] = Polymer::VecPtr{polymer};
  } else {
    promoter_map_[promoter_name].push_back(polymer);
  }
}